

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parameter.hpp
# Opt level: O3

void __thiscall
boost::runtime::basic_param::usage(basic_param *this,ostream *ostr,cstring *negation_prefix_)

{
  bool bVar1;
  pointer ppVar2;
  pointer pcVar3;
  ostream *poVar4;
  _func_int **pp_Var5;
  long lVar6;
  char **ppcVar7;
  long lVar8;
  pointer *ppcVar9;
  size_type sVar10;
  pointer ppVar11;
  char *pcVar12;
  size_type sVar13;
  char local_81;
  cstring *local_80;
  char *local_78;
  char *local_70;
  pointer local_68;
  pointer local_60;
  pointer local_58;
  pointer local_50;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  
  local_80 = negation_prefix_;
  std::__ostream_insert<char,std::char_traits<char>>(ostr,"Parameter: ",0xb);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (ostr,(this->p_name)._M_dataplus._M_p,(this->p_name)._M_string_length);
  local_81 = '\n';
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,&local_81,1);
  if ((this->p_description)._M_string_length != 0) {
    local_81 = ' ';
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>(ostr,&local_81,1);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar4,(this->p_description)._M_dataplus._M_p,
                        (this->p_description)._M_string_length);
    local_81 = '\n';
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,&local_81,1);
  }
  std::__ostream_insert<char,std::char_traits<char>>(ostr," Command line formats:\n",0x17);
  ppVar11 = (this->m_cla_ids).
            super__Vector_base<boost::runtime::parameter_cla_id,_std::allocator<boost::runtime::parameter_cla_id>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppVar2 = (this->m_cla_ids).
           super__Vector_base<boost::runtime::parameter_cla_id,_std::allocator<boost::runtime::parameter_cla_id>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (ppVar11 != ppVar2) {
    lVar6 = DAT_001cdc28;
    lVar8 = help_prefix;
    do {
      sVar10 = (ppVar11->m_prefix)._M_string_length;
      if (lVar6 - lVar8 == sVar10) {
        if (sVar10 != 0) {
          sVar13 = 0;
          do {
            if (*(char *)(lVar8 + sVar13) != (ppVar11->m_prefix)._M_dataplus._M_p[sVar13])
            goto LAB_00187535;
            sVar13 = sVar13 + 1;
          } while (sVar10 != sVar13);
        }
      }
      else {
LAB_00187535:
        std::__ostream_insert<char,std::char_traits<char>>(ostr,"   ",3);
        std::__ostream_insert<char,std::char_traits<char>>
                  (ostr,(ppVar11->m_prefix)._M_dataplus._M_p,(ppVar11->m_prefix)._M_string_length);
        pcVar3 = (ppVar11->m_tag)._M_dataplus._M_p;
        if (ppVar11->m_negatable == true) {
          local_50 = pcVar3 + (ppVar11->m_tag)._M_string_length;
          local_48 = *(undefined4 *)&local_80->m_begin;
          uStack_44 = *(undefined4 *)((long)&local_80->m_begin + 4);
          uStack_40 = *(undefined4 *)&local_80->m_end;
          uStack_3c = *(undefined4 *)((long)&local_80->m_end + 4);
          pp_Var5 = this->_vptr_basic_param;
          ppcVar9 = &local_58;
          ppcVar7 = (char **)&local_48;
          local_58 = pcVar3;
        }
        else {
          local_60 = pcVar3 + (ppVar11->m_tag)._M_string_length;
          local_78 = "";
          local_70 = "";
          pp_Var5 = this->_vptr_basic_param;
          ppcVar9 = &local_68;
          ppcVar7 = &local_78;
          local_68 = pcVar3;
        }
        (*pp_Var5[7])(this,ostr,ppcVar9,ppcVar7);
        bVar1 = (this->p_has_optional_value).super_class_property<bool>.value;
        if (bVar1 == true) {
          local_81 = '[';
          std::__ostream_insert<char,std::char_traits<char>>(ostr,&local_81,1);
        }
        sVar10 = (ppVar11->m_value_separator)._M_string_length;
        if (sVar10 == 0) {
          local_81 = ' ';
          sVar10 = 1;
          pcVar12 = &local_81;
        }
        else {
          pcVar12 = (ppVar11->m_value_separator)._M_dataplus._M_p;
        }
        std::__ostream_insert<char,std::char_traits<char>>(ostr,pcVar12,sVar10);
        (*this->_vptr_basic_param[8])(this,ostr);
        if (bVar1 != false) {
          local_81 = ']';
          std::__ostream_insert<char,std::char_traits<char>>(ostr,&local_81,1);
        }
        local_81 = '\n';
        std::__ostream_insert<char,std::char_traits<char>>(ostr,&local_81,1);
        lVar6 = DAT_001cdc28;
        lVar8 = help_prefix;
      }
      ppVar11 = ppVar11 + 1;
    } while (ppVar11 != ppVar2);
  }
  if ((this->p_env_var)._M_string_length != 0) {
    std::__ostream_insert<char,std::char_traits<char>>(ostr," Environment variable: ",0x17);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (ostr,(this->p_env_var)._M_dataplus._M_p,(this->p_env_var)._M_string_length);
    local_81 = '\n';
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,&local_81,1);
  }
  return;
}

Assistant:

virtual void            usage( std::ostream& ostr, cstring negation_prefix_ )
    {
        ostr     << "Parameter: " << p_name << '\n';
        if( !p_description.empty() )
            ostr << ' ' << p_description << '\n';

        ostr     << " Command line formats:\n";
        BOOST_TEST_FOREACH( parameter_cla_id const&, id, cla_ids() ) {
            if( id.m_prefix == help_prefix )
                continue;

            ostr << "   " << id.m_prefix;
            if( id.m_negatable )
                cla_name_help( ostr, id.m_tag, negation_prefix_ );
            else
                cla_name_help( ostr, id.m_tag, "" );

            bool optional_value_ = false;

            if( p_has_optional_value ) {
                optional_value_ = true;
                ostr << '[';
            }

            if( id.m_value_separator.empty() )
                ostr << ' ';
            else {
                ostr << id.m_value_separator;
            }

            value_help( ostr );

            if( optional_value_ )
                ostr << ']';

            ostr << '\n';
        }
        if( !p_env_var.empty() )
            ostr << " Environment variable: " << p_env_var << '\n';
    }